

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_shutdown(Curl_easy *data,connectdata *conn,int sockindex)

{
  ssl_backend_data *psVar1;
  int iVar2;
  ulong error;
  char *pcVar3;
  uint *puVar4;
  size_t size;
  int iVar5;
  bool bVar6;
  int local_13c;
  char buf [256];
  
  psVar1 = conn->ssl[sockindex].backend;
  if ((data->set).ftp_ccc == CURLFTPSSL_CCC_ACTIVE) {
    SSL_shutdown((SSL *)psVar1->handle);
  }
  if (psVar1->handle == (SSL *)0x0) {
    return 0;
  }
  bVar6 = false;
  iVar5 = 10;
  local_13c = 0;
  do {
    iVar5 = -iVar5;
    while( true ) {
      iVar5 = iVar5 + 1;
      if ((bVar6) || (iVar5 == 1)) {
        if (((data->set).field_0x9a3 & 0x40) != 0) {
          iVar5 = SSL_get_shutdown((SSL *)psVar1->handle);
          if (iVar5 - 1U < 3) {
            Curl_infof(data,&DAT_0015e110 + *(int *)(&DAT_0015e110 + (ulong)(iVar5 - 1U) * 4));
          }
        }
        SSL_free((SSL *)psVar1->handle);
        psVar1->handle = (SSL *)0x0;
        return local_13c;
      }
      iVar2 = Curl_socket_check(conn->sock[sockindex],-1,-1,10000);
      if (iVar2 < 1) break;
      ERR_clear_error();
      iVar2 = SSL_read((SSL *)psVar1->handle,buf,0x100);
      iVar2 = SSL_get_error((SSL *)psVar1->handle,iVar2);
      bVar6 = true;
      switch(iVar2) {
      case 0:
      case 6:
        break;
      default:
        error = ERR_get_error();
        if (error == 0) {
          pcVar3 = SSL_ERROR_to_str(iVar2);
        }
        else {
          pcVar3 = buf;
          ossl_strerror(error,pcVar3,size);
        }
        puVar4 = (uint *)__errno_location();
        Curl_failf(data,"OpenSSL SSL_read on shutdown: %s, errno %d",pcVar3,(ulong)*puVar4);
        break;
      case 2:
        bVar6 = false;
        pcVar3 = "SSL_ERROR_WANT_READ";
        goto LAB_0014cc53;
      case 3:
        pcVar3 = "SSL_ERROR_WANT_WRITE";
LAB_0014cc53:
        Curl_infof(data,pcVar3);
      }
switchD_0014cc1d_caseD_0:
    }
    if (iVar2 == 0) {
      Curl_failf(data,"SSL shutdown timeout");
      bVar6 = true;
      goto switchD_0014cc1d_caseD_0;
    }
    puVar4 = (uint *)__errno_location();
    Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar4);
    iVar5 = -iVar5;
    bVar6 = true;
    local_13c = -1;
  } while( true );
}

Assistant:

static int ossl_shutdown(struct Curl_easy *data,
                         struct connectdata *conn, int sockindex)
{
  int retval = 0;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  char buf[256]; /* We will use this for the OpenSSL error buffer, so it has
                    to be at least 256 bytes long. */
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  int err;
  bool done = FALSE;
  struct ssl_backend_data *backend = connssl->backend;
  int loop = 10;

#ifndef CURL_DISABLE_FTP
  /* This has only been tested on the proftpd server, and the mod_tls code
     sends a close notify alert without waiting for a close notify alert in
     response. Thus we wait for a close notify alert from the server, but
     we do not send one. Let's hope other servers do the same... */

  if(data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE)
      (void)SSL_shutdown(backend->handle);
#endif

  if(backend->handle) {
    buffsize = (int)sizeof(buf);
    while(!done && loop--) {
      int what = SOCKET_READABLE(conn->sock[sockindex],
                                 SSL_SHUTDOWN_TIMEOUT);
      if(what > 0) {
        ERR_clear_error();

        /* Something to read, let's do it and hope that it is the close
           notify alert from the server */
        nread = (ssize_t)SSL_read(backend->handle, buf, buffsize);
        err = SSL_get_error(backend->handle, (int)nread);

        switch(err) {
        case SSL_ERROR_NONE: /* this is not an error */
        case SSL_ERROR_ZERO_RETURN: /* no more data */
          /* This is the expected response. There was no data but only
             the close notify alert */
          done = TRUE;
          break;
        case SSL_ERROR_WANT_READ:
          /* there's data pending, re-invoke SSL_read() */
          infof(data, "SSL_ERROR_WANT_READ");
          break;
        case SSL_ERROR_WANT_WRITE:
          /* SSL wants a write. Really odd. Let's bail out. */
          infof(data, "SSL_ERROR_WANT_WRITE");
          done = TRUE;
          break;
        default:
          /* openssl/ssl.h says "look at error stack/return value/errno" */
          sslerror = ERR_get_error();
          failf(data, OSSL_PACKAGE " SSL_read on shutdown: %s, errno %d",
                (sslerror ?
                 ossl_strerror(sslerror, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
          done = TRUE;
          break;
        }
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        done = TRUE;
      }
      else {
        /* anything that gets here is fatally bad */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        retval = -1;
        done = TRUE;
      }
    } /* while()-loop for the select() */

    if(data->set.verbose) {
#ifdef HAVE_SSL_GET_SHUTDOWN
      switch(SSL_get_shutdown(backend->handle)) {
      case SSL_SENT_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN");
        break;
      case SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN");
        break;
      case SSL_SENT_SHUTDOWN|SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|"
              "SSL_RECEIVED__SHUTDOWN");
        break;
      }
#endif
    }

    SSL_free(backend->handle);
    backend->handle = NULL;
  }
  return retval;
}